

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O2

xcb_input_set_device_valuators_cookie_t
xcb_input_set_device_valuators_unchecked
          (xcb_connection_t *c,uint8_t device_id,uint8_t first_valuator,uint8_t num_valuators,
          int32_t *valuators)

{
  uint uVar1;
  undefined7 in_register_00000009;
  long in_FS_OFFSET;
  undefined4 local_70;
  uint8_t local_6c;
  uint8_t local_6b;
  uint8_t local_6a;
  undefined1 local_69;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 *local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  int32_t *local_28;
  ulong local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = 0xaaaaaaaaaaaaaaaa;
  uStack_50 = 0xaaaaaaaaaaaaaaaa;
  local_68 = 0xaaaaaaaaaaaaaaaa;
  uStack_60 = 0xaaaaaaaaaaaaaaaa;
  local_48 = &local_70;
  local_70 = 0xaaaaaaaa;
  local_69 = 0;
  local_40 = 8;
  local_38 = 0;
  uStack_30 = 0;
  local_20 = (ulong)(uint)((int)CONCAT71(in_register_00000009,num_valuators) << 2);
  local_18 = 0;
  uStack_10 = 0;
  local_6c = device_id;
  local_6b = first_valuator;
  local_6a = num_valuators;
  local_28 = valuators;
  uVar1 = xcb_send_request(c,0,&local_48,&xcb_input_set_device_valuators_unchecked::xcb_req);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (xcb_input_set_device_valuators_cookie_t)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

xcb_input_set_device_valuators_cookie_t
xcb_input_set_device_valuators_unchecked (xcb_connection_t *c,
                                          uint8_t           device_id,
                                          uint8_t           first_valuator,
                                          uint8_t           num_valuators,
                                          const int32_t    *valuators)
{
    static const xcb_protocol_request_t xcb_req = {
        .count = 4,
        .ext = &xcb_input_id,
        .opcode = XCB_INPUT_SET_DEVICE_VALUATORS,
        .isvoid = 0
    };

    struct iovec xcb_parts[6];
    xcb_input_set_device_valuators_cookie_t xcb_ret;
    xcb_input_set_device_valuators_request_t xcb_out;

    xcb_out.device_id = device_id;
    xcb_out.first_valuator = first_valuator;
    xcb_out.num_valuators = num_valuators;
    xcb_out.pad0 = 0;

    xcb_parts[2].iov_base = (char *) &xcb_out;
    xcb_parts[2].iov_len = sizeof(xcb_out);
    xcb_parts[3].iov_base = 0;
    xcb_parts[3].iov_len = -xcb_parts[2].iov_len & 3;
    /* int32_t valuators */
    xcb_parts[4].iov_base = (char *) valuators;
    xcb_parts[4].iov_len = num_valuators * sizeof(int32_t);
    xcb_parts[5].iov_base = 0;
    xcb_parts[5].iov_len = -xcb_parts[4].iov_len & 3;

    xcb_ret.sequence = xcb_send_request(c, 0, xcb_parts + 2, &xcb_req);
    return xcb_ret;
}